

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O0

void __thiscall QAbstractSlider::keyPressEvent(QAbstractSlider *this,QKeyEvent *ev)

{
  bool bVar1;
  int iVar2;
  QAbstractSliderPrivate *pQVar3;
  QKeyEvent *in_RSI;
  SliderAction action;
  QAbstractSliderPrivate *d;
  int local_1c;
  
  pQVar3 = d_func((QAbstractSlider *)0x50e291);
  local_1c = 0;
  iVar2 = QKeyEvent::key(in_RSI);
  switch(iVar2) {
  case 0x1000010:
    local_1c = 5;
    break;
  case 0x1000011:
    local_1c = 6;
    break;
  case 0x1000012:
    bVar1 = QWidget::isRightToLeft((QWidget *)0x50e2dd);
    if (bVar1) {
      local_1c = 1;
      if (((byte)pQVar3->field_0x27c >> 4 & 1) != 0) {
        local_1c = 2;
      }
    }
    else {
      local_1c = 1;
      if (((byte)pQVar3->field_0x27c >> 4 & 1) == 0) {
        local_1c = 2;
      }
    }
    break;
  case 0x1000013:
    local_1c = 1;
    if (((byte)pQVar3->field_0x27c >> 4 & 1) != 0) {
      local_1c = 2;
    }
    break;
  case 0x1000014:
    bVar1 = QWidget::isRightToLeft((QWidget *)0x50e34b);
    if (bVar1) {
      local_1c = 2;
      if (((byte)pQVar3->field_0x27c >> 4 & 1) != 0) {
        local_1c = 1;
      }
    }
    else {
      local_1c = 2;
      if (((byte)pQVar3->field_0x27c >> 4 & 1) == 0) {
        local_1c = 1;
      }
    }
    break;
  case 0x1000015:
    local_1c = 2;
    if (((byte)pQVar3->field_0x27c >> 4 & 1) != 0) {
      local_1c = 1;
    }
    break;
  case 0x1000016:
    local_1c = 3;
    if (((byte)pQVar3->field_0x27c >> 4 & 1) != 0) {
      local_1c = 4;
    }
    break;
  case 0x1000017:
    local_1c = 4;
    if (((byte)pQVar3->field_0x27c >> 4 & 1) != 0) {
      local_1c = 3;
    }
    break;
  default:
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (local_1c != 0) {
    triggerAction((QAbstractSlider *)in_RSI,(SliderAction)((ulong)pQVar3 >> 0x20));
  }
  return;
}

Assistant:

void QAbstractSlider::keyPressEvent(QKeyEvent *ev)
{
    Q_D(QAbstractSlider);
    SliderAction action = SliderNoAction;
#ifdef QT_KEYPAD_NAVIGATION
    if (ev->isAutoRepeat()) {
        if (!d->firstRepeat.isValid())
            d->firstRepeat.start();
        else if (1 == d->repeatMultiplier) {
            // This is the interval in milli seconds which one key repetition
            // takes.
            const int repeatMSecs = d->firstRepeat.elapsed();

            /**
             * The time it takes to currently navigate the whole slider.
             */
            const qreal currentTimeElapse = (qreal(maximum()) / singleStep()) * repeatMSecs;

            /**
             * This is an arbitrarily determined constant in msecs that
             * specifies how long time it should take to navigate from the
             * start to the end(excluding starting key auto repeat).
             */
            const int SliderRepeatElapse = 2500;

            d->repeatMultiplier = currentTimeElapse / SliderRepeatElapse;
        }

    }
    else if (d->firstRepeat.isValid()) {
        d->firstRepeat.invalidate();
        d->repeatMultiplier = 1;
    }

#endif

    switch (ev->key()) {
#ifdef QT_KEYPAD_NAVIGATION
        case Qt::Key_Select:
            if (QApplicationPrivate::keypadNavigationEnabled())
                setEditFocus(!hasEditFocus());
            else
                ev->ignore();
            break;
        case Qt::Key_Back:
            if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()) {
                setValue(d->origValue);
                setEditFocus(false);
            } else
                ev->ignore();
            break;
#endif

        case Qt::Key_Left:
#ifdef QT_KEYPAD_NAVIGATION
            // In QApplication::KeypadNavigationDirectional, we want to change the slider
            // value if there is no left/right navigation possible and if this slider is not
            // inside a tab widget.
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (!hasEditFocus() && QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Vertical
                    || !hasEditFocus()
                    && (QWidgetPrivate::canKeypadNavigate(Qt::Horizontal) || QWidgetPrivate::inTabWidget(this)))) {
                ev->ignore();
                return;
            }
            if (QApplicationPrivate::keypadNavigationEnabled() && d->orientation == Qt::Vertical)
                action = d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            else
#endif
            if (isRightToLeft())
                action = d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            else
                action = !d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            break;
        case Qt::Key_Right:
#ifdef QT_KEYPAD_NAVIGATION
            // Same logic as in Qt::Key_Left
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (!hasEditFocus() && QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Vertical
                    || !hasEditFocus()
                    && (QWidgetPrivate::canKeypadNavigate(Qt::Horizontal) || QWidgetPrivate::inTabWidget(this)))) {
                ev->ignore();
                return;
            }
            if (QApplicationPrivate::keypadNavigationEnabled() && d->orientation == Qt::Vertical)
                action = d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            else
#endif
            if (isRightToLeft())
                action = d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            else
                action = !d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            break;
        case Qt::Key_Up:
#ifdef QT_KEYPAD_NAVIGATION
            // In QApplication::KeypadNavigationDirectional, we want to change the slider
            // value if there is no up/down navigation possible.
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Horizontal
                    || !hasEditFocus() && QWidgetPrivate::canKeypadNavigate(Qt::Vertical))) {
                ev->ignore();
                break;
            }
#endif
            action = d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            break;
        case Qt::Key_Down:
#ifdef QT_KEYPAD_NAVIGATION
            // Same logic as in Qt::Key_Up
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Horizontal
                    || !hasEditFocus() && QWidgetPrivate::canKeypadNavigate(Qt::Vertical))) {
                ev->ignore();
                break;
            }
#endif
            action = d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            break;
        case Qt::Key_PageUp:
            action = d->invertedControls ? SliderPageStepSub : SliderPageStepAdd;
            break;
        case Qt::Key_PageDown:
            action = d->invertedControls ? SliderPageStepAdd : SliderPageStepSub;
            break;
        case Qt::Key_Home:
            action = SliderToMinimum;
            break;
        case Qt::Key_End:
            action = SliderToMaximum;
            break;
        default:
            ev->ignore();
            break;
    }
    if (action)
        triggerAction(action);
}